

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O3

void __thiscall
poincare_disc::Distance<double>::backward
          (Distance<double> *this,Vector<double> *grad_u,Vector<double> *grad_v,real grad_output)

{
  element_type *peVar1;
  element_type *peVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = this->gamma_;
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    dVar5 = dVar5 * dVar5 + -1.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar7 = (4.0 / dVar5) * grad_output;
    dVar6 = dVar7 / this->beta_;
    dVar5 = this->alpha_;
    dVar7 = dVar7 / dVar5;
    Vector<double>::assign_
              (grad_u,((((this->vv_ - (this->uv_ + this->uv_)) + 1.0) * dVar6) / dVar5) / dVar5,
               &this->u_);
    uVar3 = (uint)grad_u->dim_;
    if (0 < (int)uVar3) {
      dVar5 = this->alpha_;
      peVar1 = (this->v_).data_.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (grad_u->data_).super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = 0;
      do {
        peVar2[uVar4] = peVar1[uVar4] * (-dVar6 / dVar5) + peVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
    Vector<double>::assign_
              (grad_v,((((this->uu_ - (this->uv_ + this->uv_)) + 1.0) * dVar7) / this->beta_) /
                      this->beta_,&this->v_);
    uVar3 = (uint)grad_v->dim_;
    if (0 < (int)uVar3) {
      dVar5 = this->beta_;
      peVar1 = (this->u_).data_.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (grad_v->data_).super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = 0;
      do {
        peVar2[uVar4] = peVar1[uVar4] * (-dVar7 / dVar5) + peVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  else {
    if (0 < (int)grad_u->dim_) {
      memset((grad_u->data_).super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
             (grad_u->dim_ & 0x7fffffff) << 3);
    }
    if (0 < (int)grad_v->dim_) {
      memset((grad_v->data_).super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
             (grad_v->dim_ & 0x7fffffff) << 3);
      return;
    }
  }
  return;
}

Assistant:

void backward(Vector<real>& grad_u, Vector<real>& grad_v, real grad_output)
    {
      real c = grad_output;
      
      if(gamma_ == 1){
        grad_u.zero_();
        grad_v.zero_();
        return;
      }

      c *= 4 / std::sqrt(gamma_ * gamma_ - 1);
      real cu = c / beta_; 
      real cv = c / alpha_;
  
      grad_u.assign_(cu * (vv_ - 2 * uv_ + 1) / alpha_ / alpha_, u_);
      grad_u.add_(-cu / alpha_, v_);

      grad_v.assign_(cv * (uu_ - 2 * uv_ + 1) / beta_ / beta_, v_);
      grad_v.add_(-cv / beta_, u_);
      
    }